

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip6.c
# Opt level: O0

Curl_addrinfo * Curl_getaddrinfo(connectdata *conn,char *hostname,int port,int *waitp)

{
  Curl_easy *data_00;
  _Bool _Var1;
  int iVar2;
  Curl_easy *data;
  undefined1 local_108 [4];
  int pf;
  char addrbuf [128];
  char **local_80;
  char *sbufptr;
  char sbuf [12];
  int error;
  Curl_addrinfo *res;
  addrinfo hints;
  int *waitp_local;
  int port_local;
  char *hostname_local;
  connectdata *conn_local;
  
  local_80 = (char **)0x0;
  data_00 = conn->data;
  *waitp = 0;
  if (conn->ip_version == 1) {
    data._4_4_ = 2;
  }
  else if (conn->ip_version == 2) {
    data._4_4_ = 10;
  }
  else {
    data._4_4_ = 0;
  }
  hints.ai_next = (addrinfo *)waitp;
  if ((data._4_4_ != 2) && (_Var1 = Curl_ipv6works(), !_Var1)) {
    data._4_4_ = 2;
  }
  memset(&res,0,0x30);
  res._4_4_ = data._4_4_;
  hints.ai_flags = conn->socktype;
  iVar2 = inet_pton(2,hostname,local_108);
  if ((iVar2 == 1) || (iVar2 = inet_pton(10,hostname,local_108), iVar2 == 1)) {
    res._0_4_ = 4;
  }
  if (port != 0) {
    curl_msnprintf((char *)&sbufptr,0xc,"%d",(ulong)(uint)port);
    local_80 = &sbufptr;
  }
  sbuf._4_4_ = Curl_getaddrinfo_ex(hostname,(char *)local_80,(addrinfo *)&res,
                                   (Curl_addrinfo **)(sbuf + 8));
  if (sbuf._4_4_ == 0) {
    conn_local = stack0xffffffffffffff98;
  }
  else {
    Curl_infof(data_00,"getaddrinfo(3) failed for %s:%d\n",hostname,(ulong)(uint)port);
    conn_local = (connectdata *)0x0;
  }
  return (Curl_addrinfo *)conn_local;
}

Assistant:

Curl_addrinfo *Curl_getaddrinfo(struct connectdata *conn,
                                const char *hostname,
                                int port,
                                int *waitp)
{
  struct addrinfo hints;
  Curl_addrinfo *res;
  int error;
  char sbuf[12];
  char *sbufptr = NULL;
#ifndef USE_RESOLVE_ON_IPS
  char addrbuf[128];
#endif
  int pf;
#if !defined(CURL_DISABLE_VERBOSE_STRINGS)
  struct Curl_easy *data = conn->data;
#endif

  *waitp = 0; /* synchronous response only */

  /* Check if a limited name resolve has been requested */
  switch(conn->ip_version) {
  case CURL_IPRESOLVE_V4:
    pf = PF_INET;
    break;
  case CURL_IPRESOLVE_V6:
    pf = PF_INET6;
    break;
  default:
    pf = PF_UNSPEC;
    break;
  }

  if((pf != PF_INET) && !Curl_ipv6works())
    /* The stack seems to be a non-IPv6 one */
    pf = PF_INET;

  memset(&hints, 0, sizeof(hints));
  hints.ai_family = pf;
  hints.ai_socktype = conn->socktype;

#ifndef USE_RESOLVE_ON_IPS
  /*
   * The AI_NUMERICHOST must not be set to get synthesized IPv6 address from
   * an IPv4 address on iOS and Mac OS X.
   */
  if((1 == Curl_inet_pton(AF_INET, hostname, addrbuf)) ||
     (1 == Curl_inet_pton(AF_INET6, hostname, addrbuf))) {
    /* the given address is numerical only, prevent a reverse lookup */
    hints.ai_flags = AI_NUMERICHOST;
  }
#endif

  if(port) {
    snprintf(sbuf, sizeof(sbuf), "%d", port);
    sbufptr = sbuf;
  }

  error = Curl_getaddrinfo_ex(hostname, sbufptr, &hints, &res);
  if(error) {
    infof(data, "getaddrinfo(3) failed for %s:%d\n", hostname, port);
    return NULL;
  }

  if(port) {
    Curl_addrinfo_set_port(res, port);
  }

  dump_addrinfo(conn, res);

  return res;
}